

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ralocal.cpp
# Opt level: O3

Error __thiscall
asmjit::v1_14::RALocalAllocator::allocBranch
          (RALocalAllocator *this,InstNode *node,RABlock *target,RABlock *cont)

{
  uint **ppuVar1;
  uint **ppuVar2;
  uint uVar3;
  BaseNode *node_00;
  WorkToPhysMap *pWVar4;
  PhysToWorkMap *pPVar5;
  PhysToWorkMap *pPVar6;
  uint *puVar7;
  uint *puVar8;
  uint *puVar9;
  Error EVar10;
  RABlock *pRVar11;
  BaseNode *pBVar12;
  BaseCompiler *pBVar13;
  long lVar14;
  Label trampoline;
  Label savedTarget;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined8 local_48;
  undefined8 uStack_40;
  
  (this->_cc->super_BaseBuilder)._cursor = *(BaseNode **)node;
  if ((*(PhysToWorkMap **)(target + 200) != (PhysToWorkMap *)0x0) &&
     (EVar10 = switchToAssignment(this,*(PhysToWorkMap **)(target + 200),
                                  (ZoneBitVector *)(target + 0x78),
                                  SUB41((*(uint *)(target + 0xc) & 8) >> 3,0),true), EVar10 != 0)) {
    return EVar10;
  }
  EVar10 = allocInst(this,node);
  if (EVar10 != 0) {
    return EVar10;
  }
  uVar3 = *(uint *)(target + 0xb8);
  if ((ulong)uVar3 == 0xffffffff) {
    pRVar11 = target + 0xbc;
LAB_00123b18:
    EVar10 = spillScratchGpRegsBeforeEntry(this,*(RegMask *)pRVar11);
    if (EVar10 != 0) {
      return EVar10;
    }
    if (*(long *)(target + 200) == 0) {
      EVar10 = BaseRAPass::setBlockEntryAssignment
                         (this->_pass,target,this->_block,&this->_curAssignment);
      if (EVar10 != 0) {
        return EVar10;
      }
    }
    else {
      node_00 = *(BaseNode **)this->_pass->_extraBlock;
      pBVar12 = BaseBuilder::setCursor(&this->_cc->super_BaseBuilder,node_00);
      pWVar4 = (this->_curAssignment)._workToPhysMap;
      memcpy((this->_tmpAssignment)._physToWorkMap,(this->_curAssignment)._physToWorkMap,
             (ulong)(this->_tmpAssignment)._layout.physTotal * 4 + 0x20);
      memcpy((this->_tmpAssignment)._workToPhysMap,pWVar4,
             (ulong)(this->_tmpAssignment)._layout.workCount);
      EVar10 = switchToAssignment(this,*(PhysToWorkMap **)(target + 200),
                                  (ZoneBitVector *)(target + 0x78),
                                  SUB41((*(uint *)(target + 0xc) & 8) >> 3,0),false);
      if (EVar10 != 0) {
        return EVar10;
      }
      pBVar13 = this->_cc;
      if ((pBVar13->super_BaseBuilder)._cursor != node_00) {
        if ((uint)(byte)node[0x13] <= (byte)node[0x12] - 1) goto LAB_00123cba;
        lVar14 = (ulong)((byte)node[0x12] - 1) * 0x10;
        if ((*(uint *)(node + lVar14 + 0x40) & 7) != 5) goto LAB_00123cbf;
        (*(pBVar13->super_BaseBuilder).super_BaseEmitter._vptr_BaseEmitter[4])(&local_58);
        local_48 = *(undefined8 *)(node + lVar14 + 0x40);
        uStack_40 = *(undefined8 *)(node + lVar14 + 0x48);
        *(undefined4 *)(node + lVar14 + 0x40) = local_58;
        *(undefined4 *)(node + lVar14 + 0x44) = uStack_54;
        *(undefined4 *)(node + lVar14 + 0x48) = uStack_50;
        *(undefined4 *)(node + lVar14 + 0x4c) = uStack_4c;
        node[0x34] = (InstNode)((byte)node[0x34] & 0xef);
        EVar10 = (*(this->_pass->super_FuncPass).super_Pass._vptr_Pass[0xd])();
        if (EVar10 != 0) {
          return EVar10;
        }
        pBVar13 = this->_cc;
        (pBVar13->super_BaseBuilder)._cursor = node_00;
        (*(pBVar13->super_BaseBuilder).super_BaseEmitter._vptr_BaseEmitter[6])(pBVar13,&local_58);
        pBVar13 = this->_cc;
      }
      (pBVar13->super_BaseBuilder)._cursor = pBVar12;
      pWVar4 = (this->_curAssignment)._workToPhysMap;
      pPVar5 = (this->_curAssignment)._physToWorkMap;
      pPVar6 = (this->_tmpAssignment)._physToWorkMap;
      (this->_curAssignment)._workToPhysMap = (this->_tmpAssignment)._workToPhysMap;
      (this->_curAssignment)._physToWorkMap = pPVar6;
      (this->_tmpAssignment)._workToPhysMap = pWVar4;
      (this->_tmpAssignment)._physToWorkMap = pPVar5;
      lVar14 = 0;
      do {
        ppuVar1 = (this->_curAssignment)._physToWorkIds._data + lVar14;
        puVar7 = *ppuVar1;
        puVar8 = ppuVar1[1];
        ppuVar2 = (this->_tmpAssignment)._physToWorkIds._data + lVar14;
        puVar9 = ppuVar2[1];
        ppuVar1 = (this->_curAssignment)._physToWorkIds._data + lVar14;
        *ppuVar1 = *ppuVar2;
        ppuVar1[1] = puVar9;
        ppuVar1 = (this->_tmpAssignment)._physToWorkIds._data + lVar14;
        *ppuVar1 = puVar7;
        ppuVar1[1] = puVar8;
        lVar14 = lVar14 + 2;
      } while (lVar14 != 4);
    }
    EVar10 = 0;
  }
  else {
    if (uVar3 < *(uint *)(*(long *)target + 0xf0)) {
      pRVar11 = (RABlock *)((ulong)uVar3 * 0x20 + *(long *)(*(long *)target + 0xe8));
      goto LAB_00123b18;
    }
    allocBranch();
LAB_00123cba:
    allocBranch();
LAB_00123cbf:
    EVar10 = 3;
  }
  return EVar10;
}

Assistant:

Error RALocalAllocator::allocBranch(InstNode* node, RABlock* target, RABlock* cont) noexcept {
  // TODO: This should be used to make the branch allocation better.
  DebugUtils::unused(cont);

  // The cursor must point to the previous instruction for a possible instruction insertion.
  _cc->_setCursor(node->prev());

  // Use TryMode of `switchToAssignment()` if possible.
  if (target->hasEntryAssignment()) {
    ASMJIT_PROPAGATE(switchToAssignment(target->entryPhysToWorkMap(), target->liveIn(), target->isAllocated(), true));
  }

  ASMJIT_PROPAGATE(allocInst(node));
  ASMJIT_PROPAGATE(spillRegsBeforeEntry(target));

  if (target->hasEntryAssignment()) {
    BaseNode* injectionPoint = _pass->extraBlock()->prev();
    BaseNode* prevCursor = _cc->setCursor(injectionPoint);

    _tmpAssignment.copyFrom(_curAssignment);
    ASMJIT_PROPAGATE(switchToAssignment(target->entryPhysToWorkMap(), target->liveIn(), target->isAllocated(), false));

    BaseNode* curCursor = _cc->cursor();
    if (curCursor != injectionPoint) {
      // Additional instructions emitted to switch from the current state to the `target` state. This means
      // that we have to move these instructions into an independent code block and patch the jump location.
      Operand& targetOp = node->op(node->opCount() - 1);
      if (ASMJIT_UNLIKELY(!targetOp.isLabel())) {
        return DebugUtils::errored(kErrorInvalidState);
      }

      Label trampoline = _cc->newLabel();
      Label savedTarget = targetOp.as<Label>();

      // Patch `target` to point to the `trampoline` we just created.
      targetOp = trampoline;

      // Clear a possible SHORT form as we have no clue now if the SHORT form would be encodable after patching
      // the target to `trampoline` (X86 specific).
      node->clearOptions(InstOptions::kShortForm);

      // Finalize the switch assignment sequence.
      ASMJIT_PROPAGATE(_pass->emitJump(savedTarget));
      _cc->_setCursor(injectionPoint);
      _cc->bind(trampoline);
    }

    _cc->_setCursor(prevCursor);
    _curAssignment.swap(_tmpAssignment);
  }
  else {
    ASMJIT_PROPAGATE(_pass->setBlockEntryAssignment(target, block(), _curAssignment));
  }

  return kErrorOk;
}